

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O3

bool CoreML::Specification::operator==(Kernel *a,Kernel *b)

{
  undefined1 uVar1;
  
  if (a->_oneof_case_[0] == b->_oneof_case_[0]) {
    uVar1 = (*(code *)((long)&UINT_00353d7c + (long)(int)(&UINT_00353d7c)[a->_oneof_case_[0]]))();
    return (bool)uVar1;
  }
  return false;
}

Assistant:

inline Kernel::KernelCase Kernel::kernel_case() const {
  return Kernel::KernelCase(_oneof_case_[0]);
}